

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_common.cpp
# Opt level: O1

void dxil_spv::build_exploded_composite_from_vector(Impl *impl,Instruction *value,uint active_lanes)

{
  uint uVar1;
  Id IVar2;
  Id type_id;
  _Hash_node_base *p_Var3;
  Type *pTVar4;
  Operation *pOVar5;
  Id *pIVar6;
  ulong uVar7;
  __hash_code __code;
  Id *pIVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  ulong uVar11;
  Id extracted [4];
  Id local_48 [4];
  Instruction *local_38;
  
  uVar11 = (impl->llvm_composite_meta)._M_h._M_bucket_count;
  uVar7 = (ulong)value % uVar11;
  p_Var9 = (impl->llvm_composite_meta)._M_h._M_buckets[uVar7];
  p_Var10 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var9->_M_nxt, p_Var10 = p_Var9, (Instruction *)p_Var9->_M_nxt[1]._M_nxt != value))
  {
    while (p_Var9 = p_Var3, p_Var3 = p_Var9->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var10 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar11 != uVar7) ||
         (p_Var10 = p_Var9, (Instruction *)p_Var3[1]._M_nxt == value)) goto LAB_0014f8c3;
    }
    p_Var10 = (__node_base_ptr)0x0;
  }
LAB_0014f8c3:
  if (p_Var10 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var10->_M_nxt;
  }
  if ((p_Var3 != (_Hash_node_base *)0x0) && (*(char *)((long)&p_Var3[3]._M_nxt + 1) == '\x01')) {
    pTVar4 = LLVMBC::Value::getType(&value->super_Value);
    uVar1 = LLVMBC::Type::getStructNumElements(pTVar4);
    IVar2 = Converter::Impl::get_id_for_value(impl,&value->super_Value,0);
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    if (active_lanes != 0) {
      uVar11 = 0;
      do {
        pTVar4 = LLVMBC::Value::getType(&value->super_Value);
        pTVar4 = LLVMBC::Type::getStructElementType(pTVar4,(uint)uVar11);
        type_id = Converter::Impl::get_type_id(impl,pTVar4,0);
        pOVar5 = Converter::Impl::allocate(impl,OpCompositeExtract,type_id);
        Operation::add_id(pOVar5,IVar2);
        Operation::add_literal(pOVar5,(uint)uVar11);
        Converter::Impl::add(impl,pOVar5,false);
        local_48[uVar11] = pOVar5->id;
        uVar11 = uVar11 + 1;
      } while (active_lanes != uVar11);
    }
    local_38 = value;
    pTVar4 = LLVMBC::Value::getType(&value->super_Value);
    IVar2 = Converter::Impl::get_type_id(impl,pTVar4,0);
    pOVar5 = Converter::Impl::allocate(impl,OpCompositeConstruct,IVar2);
    if (uVar1 != 0) {
      pIVar8 = local_48;
      uVar11 = 0;
      do {
        pIVar6 = local_48 + (active_lanes - 1);
        if (uVar11 < active_lanes) {
          pIVar6 = pIVar8;
        }
        Operation::add_id(pOVar5,*pIVar6);
        uVar11 = uVar11 + 1;
        pIVar8 = pIVar8 + 1;
      } while (uVar1 != uVar11);
    }
    Converter::Impl::add(impl,pOVar5,false);
    Converter::Impl::rewrite_value(impl,&local_38->super_Value,pOVar5->id);
  }
  return;
}

Assistant:

void build_exploded_composite_from_vector(Converter::Impl &impl, const llvm::Instruction *value, unsigned active_lanes)
{
	auto itr = impl.llvm_composite_meta.find(value);
	if (itr == impl.llvm_composite_meta.end())
		return;

	auto &m = *itr;
	if (m.second.forced_struct)
	{
		// This value will be consumed by something other than plain OpCompositeExtract, force output struct type.
		unsigned elems = value->getType()->getStructNumElements();
		spv::Id id = impl.get_id_for_value(value);

		spv::Id extracted[4] = {};
		for (unsigned i = 0; i < active_lanes; i++)
		{
			auto *ext = impl.allocate(spv::OpCompositeExtract, impl.get_type_id(value->getType()->getStructElementType(i)));
			ext->add_id(id);
			ext->add_literal(i);
			impl.add(ext);
			extracted[i] = ext->id;
		}

		auto *struct_op = impl.allocate(spv::OpCompositeConstruct, impl.get_type_id(value->getType()));
		for (unsigned i = 0; i < elems; i++)
		{
			if (i < active_lanes)
				struct_op->add_id(extracted[i]);
			else
				struct_op->add_id(extracted[active_lanes - 1]);
		}

		impl.add(struct_op);
		impl.rewrite_value(value, struct_op->id);
	}
}